

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_test.cpp
# Opt level: O2

int run(char *filename)

{
  program_t *value;
  value_t *pvVar1;
  value_t *pvVar2;
  ostream *poVar3;
  int iVar4;
  source_t source;
  string local_2a0 [32];
  vm_t vm;
  ifstream input;
  int aiStack_1f8 [122];
  
  deci::vm_t::vm_t(&vm);
  std::ifstream::ifstream(&input);
  std::ifstream::open((char *)&input,(_Ios_Openmode)filename);
  if (*(int *)((long)aiStack_1f8 + *(long *)(_input + -0x18)) == 0) {
    deci::CompileExpression(&source,filename,(istream *)&input,false);
    value = deci::program_t::Create
                      (source.super__Vector_base<deci::command_t,_std::allocator<deci::command_t>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                       (long)source.
                             super__Vector_base<deci::command_t,_std::allocator<deci::command_t>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)source.
                             super__Vector_base<deci::command_t,_std::allocator<deci::command_t>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 4);
    pvVar1 = deci::vm_t::Run(&vm,(value_t *)value);
    (*(value->super_function_t).super_value_t._vptr_value_t[3])(value);
    pvVar2 = deci::nothing_t::Instance();
    if (pvVar2 != pvVar1) {
      (*pvVar1->_vptr_value_t[4])(local_2a0,pvVar1);
      poVar3 = std::operator<<((ostream *)&std::cout,local_2a0);
      std::endl<char,std::char_traits<char>>(poVar3);
      std::__cxx11::string::~string(local_2a0);
    }
    (*pvVar1->_vptr_value_t[3])(pvVar1);
    std::_Vector_base<deci::command_t,_std::allocator<deci::command_t>_>::~_Vector_base
              (&source.super__Vector_base<deci::command_t,_std::allocator<deci::command_t>_>);
    iVar4 = 0;
  }
  else {
    iVar4 = -1;
  }
  std::ifstream::~ifstream(&input);
  deci::vm_t::~vm_t(&vm);
  return iVar4;
}

Assistant:

int run(const char* filename) {

  deci::vm_t vm;

  std::ifstream input;
  input.open(filename, std::ios::in);

  if (input.good()) {
    deci::program_t::source_t source = deci::CompileExpression(filename, input,false);
    deci::program_t* prog = deci::program_t::Create(source.data(), source.size());
    deci::value_t* result = vm.Run(*prog);
    prog->Delete();

    if (!result->IsNothing())
    {
      std::cout << result->ToText() << std::endl;
    }
    result->Delete();
    return 0;
  }
  return -1;
}